

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_dynamic.cpp
# Opt level: O3

BinCompat * __thiscall ritobin::io::BinCompat::get(BinCompat *this,string_view name)

{
  BinCompat *pBVar1;
  int iVar2;
  char *__s;
  BinCompat *pBVar3;
  long lVar4;
  size_type __rlen;
  
  lVar4 = 0;
  do {
    pBVar1 = *(BinCompat **)((long)&compat_impl::bin_versions + lVar4);
    __s = (char *)(*(code *)**(undefined8 **)pBVar1)(pBVar1);
    pBVar3 = (BinCompat *)strlen(__s);
    if (pBVar3 == this) {
      if (this == (BinCompat *)0x0) {
        return pBVar1;
      }
      iVar2 = bcmp((void *)name._M_len,__s,(size_t)this);
      if (iVar2 == 0) {
        return pBVar1;
      }
    }
    lVar4 = lVar4 + 8;
    if (lVar4 == 0x10) {
      return (BinCompat *)0x0;
    }
  } while( true );
}

Assistant:

BinCompat const* BinCompat::get(std::string_view name) noexcept {
        for (auto version: bin_versions) {
            if (version->name() == name) {
                return version;
            }
        }
        return nullptr;
    }